

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PianoWidget.cpp
# Opt level: O1

int __thiscall PianoWidget::getNoteFromMouse(PianoWidget *this,QPoint mousePos)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar3 = mousePos.xp;
  iVar2 = (iVar3 / 6 + (iVar3 >> 0x1f) >> 1) - (iVar3 >> 0x1f);
  iVar6 = iVar2 % 7;
  if (0x29 < mousePos.yp) {
    lVar4 = 0;
    bVar1 = false;
    goto LAB_0017ca36;
  }
  iVar2 = iVar3 + iVar2 * -0xc;
  if (((iVar2 < 5) && (iVar6 != 0)) && (iVar6 != 3)) {
    iVar7 = (&PianoWidgetTU::BLACKKEY_LEFTOF)[iVar6];
LAB_0017ca31:
    bVar1 = true;
  }
  else {
    iVar8 = iVar6 + 1;
    bVar1 = false;
    if (iVar6 == 6) {
      iVar8 = 0;
    }
    iVar7 = (&PianoWidgetTU::BLACKKEY_LEFTOF)[iVar8];
    if (((7 < iVar2) && (bVar1 = false, iVar8 != 0)) && (iVar8 != 3)) goto LAB_0017ca31;
  }
  lVar4 = (long)iVar7;
LAB_0017ca36:
  pbVar5 = (byte *)((long)&PianoWidgetTU::WHITEKEY_TO_NOTE + (long)iVar6);
  if (bVar1) {
    pbVar5 = (byte *)((long)&PianoWidgetTU::BLACKKEY_TO_NOTE + lVar4);
  }
  return (uint)*pbVar5 + (iVar3 / 0x54) * 0xc;
}

Assistant:

int PianoWidget::getNoteFromMouse(QPoint mousePos) {
    auto const x = mousePos.x();
    auto const y = mousePos.y();

    bool isBlack = false;
    int wkeyInOctave = x / TU::WKEY_WIDTH;
    int octave = wkeyInOctave / TU::N_WHITEKEYS;
    wkeyInOctave %= TU::N_WHITEKEYS;
    int bkeyInOctave = 0;

    if (y < TU::BKEY_HEIGHT) {
        // check if the mouse is over a black key
        bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave];
        int wkeyx = x % TU::WKEY_WIDTH;

        if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx <= TU::BKEY_WIDTH_HALF) {
            // mouse is over the black key to the left of the white key
            isBlack = true;
        } else {
            // now check the right
            
            // get the black key to the left of the next white key
            bkeyInOctave = TU::BLACKKEY_LEFTOF[wkeyInOctave == TU::N_WHITEKEYS - 1 ? 0 : wkeyInOctave + 1];
            
            if (bkeyInOctave != TU::KEYINDEX_NULL && wkeyx >= TU::WKEY_WIDTH - TU::BKEY_WIDTH_HALF) {
                isBlack = true;
            }
        }
    }

    int note = octave * 12;
    if (isBlack) {
        note += TU::BLACKKEY_TO_NOTE[bkeyInOctave];
    } else {
        note += TU::WHITEKEY_TO_NOTE[wkeyInOctave];
    }

    return note;
}